

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

void __thiscall embree::XMLLoader::~XMLLoader(XMLLoader *this)

{
  Node *pNVar1;
  pointer pcVar2;
  
  if ((FILE *)this->binFile != (FILE *)0x0) {
    fclose((FILE *)this->binFile);
  }
  pNVar1 = (this->root).ptr;
  if (pNVar1 != (Node *)0x0) {
    (*(pNVar1->super_RefCount)._vptr_RefCount[3])();
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  ::~_Rb_tree(&(this->id2material)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  ::~_Rb_tree(&(this->id2node)._M_t);
  pcVar2 = (this->binFileName).filename._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->binFileName).filename.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->path).filename._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->path).filename.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

XMLLoader::~XMLLoader() {
    if (binFile) fclose(binFile);
  }